

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_ecdh_setup(void *arg)

{
  int iVar1;
  long lVar2;
  uchar point [33];
  
  point[0x10] = 0xfd;
  point[0x11] = 'u';
  point[0x12] = '|';
  point[0x13] = 0xe3;
  point[0x14] = '\x0e';
  point[0x15] = 'N';
  point[0x16] = 0x8c;
  point[0x17] = 0x90;
  point[0x18] = 0xfb;
  point[0x19] = 0xa2;
  point[0x1a] = 0xba;
  point[0x1b] = 0xd1;
  point[0x1c] = 0x84;
  point[0x1d] = 0xf8;
  point[0x1e] = 0x83;
  point[0x1f] = 0xc6;
  point[0] = '\x03';
  point[1] = 'T';
  point[2] = 0x94;
  point[3] = 0xc1;
  point[4] = ']';
  point[5] = '2';
  point[6] = '\t';
  point[7] = 0x97;
  point[8] = '\x06';
  point[9] = 0xc2;
  point[10] = '9';
  point[0xb] = '_';
  point[0xc] = 0x94;
  point[0xd] = '4';
  point[0xe] = 0x87;
  point[0xf] = 'E';
  point[0x20] = 0x9f;
  for (lVar2 = 0x48; lVar2 != 0x68; lVar2 = lVar2 + 1) {
    *(char *)((long)arg + lVar2) = (char)lVar2 + -0x47;
  }
  iVar1 = secp256k1_ec_pubkey_parse(*arg,(long)arg + 8,point,0x21);
  if (iVar1 == 1) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/bench_impl.h"
          ,0x20,
          "test condition failed: secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1"
         );
  abort();
}

Assistant:

static void bench_ecdh_setup(void* arg) {
    int i;
    bench_ecdh_data *data = (bench_ecdh_data*)arg;
    const unsigned char point[] = {
        0x03,
        0x54, 0x94, 0xc1, 0x5d, 0x32, 0x09, 0x97, 0x06,
        0xc2, 0x39, 0x5f, 0x94, 0x34, 0x87, 0x45, 0xfd,
        0x75, 0x7c, 0xe3, 0x0e, 0x4e, 0x8c, 0x90, 0xfb,
        0xa2, 0xba, 0xd1, 0x84, 0xf8, 0x83, 0xc6, 0x9f
    };

    for (i = 0; i < 32; i++) {
        data->scalar[i] = i + 1;
    }
    CHECK(secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1);
}